

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O2

pair<pstore::index::details::index_pointer,_bool> __thiscall
pstore::index::
hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
::insert_into_linear<std::pair<pstore::uint128,pstore::extent<pstore::repo::fragment>>>
          (hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
           *this,transaction_base *transaction,index_pointer node,
          pair<pstore::uint128,_pstore::extent<pstore::repo::fragment>_> *value,
          not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents,
          bool is_upsert)

{
  unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
  uVar1;
  signature_type __p;
  address aVar2;
  address *paVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *i;
  _Head_base<0UL,_pstore::index::details::linear_node_*,_false> this_00;
  ulong uVar4;
  undefined3 in_register_00000089;
  pair<const_pstore::index::details::index_pointer,_unsigned_long> pVar5;
  pair<pstore::index::details::index_pointer,_bool> pVar6;
  linear_node *orig_node;
  unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
  new_node;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70 [2];
  hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
  *local_60;
  shared_ptr<const_pstore::index::details::linear_node> lptr;
  signature_type local_40;
  shared_ptr<const_pstore::index::details::linear_node> *local_38;
  
  this_00._M_head_impl._1_3_ = in_register_00000089;
  this_00._M_head_impl._0_1_ = is_upsert;
  this_00._M_head_impl._4_4_ = 0;
  lptr.super___shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  lptr.super___shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  orig_node = (linear_node *)0x0;
  local_60 = this;
  details::linear_node::get_node
            ((pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
              *)&new_node,transaction->db_,node);
  local_40._M_elems = (_Type)&orig_node;
  local_38 = &lptr;
  std::
  tuple<std::shared_ptr<pstore::index::details::linear_node_const>&,pstore::index::details::linear_node_const*&>
  ::operator=((tuple<std::shared_ptr<pstore::index::details::linear_node_const>&,pstore::index::details::linear_node_const*&>
               *)&local_40,
              (pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
               *)&new_node);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_70);
  if (orig_node != (linear_node *)0x0) {
    pVar5 = details::linear_node::
            lookup<pstore::uint128,pstore::uint128,std::equal_to<pstore::uint128>,void>
                      (orig_node,transaction->db_,value);
    i = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVar5.second;
    if (i == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff) {
      details::linear_node::allocate_from((linear_node *)&new_node,orig_node,1);
      i = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)orig_node->size_;
      aVar2 = store_leaf_node<std::pair<pstore::uint128,pstore::extent<pstore::repo::fragment>>>
                        (local_60,transaction,value,parents);
      paVar3 = details::linear_node::operator[]
                         ((linear_node *)
                          new_node._M_t.
                          super___uniq_ptr_impl<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_pstore::index::details::linear_node_*,_std::default_delete<pstore::index::details::linear_node>_>
                          .super__Head_base<0UL,_pstore::index::details::linear_node_*,_false>.
                          _M_head_impl,(size_t)i);
      uVar1 = new_node;
      paVar3->a_ = aVar2.a_;
      new_node._M_t.
      super___uniq_ptr_impl<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::index::details::linear_node_*,_std::default_delete<pstore::index::details::linear_node>_>
      .super__Head_base<0UL,_pstore::index::details::linear_node_*,_false>._M_head_impl =
           (__uniq_ptr_data<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>,_true,_true>
            )(__uniq_ptr_impl<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
              )0x0;
      node.internal_ =
           (internal_node *)
           ((ulong)uVar1._M_t.
                   super___uniq_ptr_impl<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_pstore::index::details::linear_node_*,_std::default_delete<pstore::index::details::linear_node>_>
                   .super__Head_base<0UL,_pstore::index::details::linear_node_*,_false>._M_head_impl
           | 3);
      std::
      unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
      ::~unique_ptr(&new_node);
      uVar4 = 0;
    }
    else {
      if (is_upsert) {
        new_node._M_t.
        super___uniq_ptr_impl<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
        ._M_t.
        super__Tuple_impl<0UL,_pstore::index::details::linear_node_*,_std::default_delete<pstore::index::details::linear_node>_>
        .super__Head_base<0UL,_pstore::index::details::linear_node_*,_false>._M_head_impl =
             (__uniq_ptr_data<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>,_true,_true>
              )(__uniq_ptr_impl<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
                )0x0;
        if (((ulong)node.internal_ & 2) == 0) {
          details::linear_node::allocate_from((linear_node *)&local_40,orig_node,0);
          __p._M_elems = local_40._M_elems;
          local_40._M_elems[0] = '\0';
          local_40._M_elems[1] = '\0';
          local_40._M_elems[2] = '\0';
          local_40._M_elems[3] = '\0';
          local_40._M_elems[4] = '\0';
          local_40._M_elems[5] = '\0';
          local_40._M_elems[6] = '\0';
          local_40._M_elems[7] = '\0';
          std::
          __uniq_ptr_impl<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
          ::reset((__uniq_ptr_impl<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
                   *)&new_node,(pointer)__p._M_elems);
          std::
          unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
          ::~unique_ptr((unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
                         *)&local_40);
          node.internal_ =
               (internal_node *)
               ((ulong)new_node._M_t.
                       super___uniq_ptr_impl<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_pstore::index::details::linear_node_*,_std::default_delete<pstore::index::details::linear_node>_>
                       .super__Head_base<0UL,_pstore::index::details::linear_node_*,_false>.
                       _M_head_impl | 3);
          this_00._M_head_impl = (linear_node *)new_node;
        }
        else {
          this_00._M_head_impl = node.linear_ & 0xfffffffffffffffc;
        }
        aVar2 = store_leaf_node<std::pair<pstore::uint128,pstore::extent<pstore::repo::fragment>>>
                          (local_60,transaction,value,parents);
        paVar3 = details::linear_node::operator[](this_00._M_head_impl,(size_t)i);
        paVar3->a_ = aVar2.a_;
        new_node._M_t.
        super___uniq_ptr_impl<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
        ._M_t.
        super__Tuple_impl<0UL,_pstore::index::details::linear_node_*,_std::default_delete<pstore::index::details::linear_node>_>
        .super__Head_base<0UL,_pstore::index::details::linear_node_*,_false>._M_head_impl =
             (__uniq_ptr_data<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>,_true,_true>
              )(__uniq_ptr_impl<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
                )0x0;
        std::
        unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
        ::~unique_ptr(&new_node);
      }
      else {
        new_node._M_t.
        super___uniq_ptr_impl<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
        ._M_t.
        super__Tuple_impl<0UL,_pstore::index::details::linear_node_*,_std::default_delete<pstore::index::details::linear_node>_>
        .super__Head_base<0UL,_pstore::index::details::linear_node_*,_false>._M_head_impl =
             (__uniq_ptr_data<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>,_true,_true>
              )details::linear_node::operator[](orig_node,(size_t)i);
        local_70[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff;
        array_stack<pstore::index::details::parent_type,_13UL>::push
                  (parents.ptr_,(value_type *)&new_node);
      }
      uVar4 = CONCAT71(SUB87(this_00._M_head_impl,1),1);
    }
    new_node._M_t.
    super___uniq_ptr_impl<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::index::details::linear_node_*,_std::default_delete<pstore::index::details::linear_node>_>
    .super__Head_base<0UL,_pstore::index::details::linear_node_*,_false>._M_head_impl =
         (__uniq_ptr_data<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>,_true,_true>
          )(__uniq_ptr_data<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>,_true,_true>
            )node;
    local_70[0]._M_pi = i;
    array_stack<pstore::index::details::parent_type,_13UL>::push
              (parents.ptr_,(value_type *)&new_node);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&lptr.
                super___shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    pVar6._8_8_ = uVar4 & 0xffffffff;
    pVar6.first.internal_ = node.internal_;
    return pVar6;
  }
  assert_failed("orig_node != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                ,0x368);
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::insert_into_linear (
            transaction_base & transaction, index_pointer const node, OtherValueType const & value,
            gsl::not_null<parent_stack *> parents, bool const is_upsert)
            -> std::pair<index_pointer, bool> {

            index_pointer result;
            bool key_exists = false;

            std::shared_ptr<linear_node const> lptr;
            linear_node const * orig_node = nullptr;
            std::tie (lptr, orig_node) = linear_node::get_node (transaction.db (), node);
            PSTORE_ASSERT (orig_node != nullptr);

            index_pointer child_slot;
            auto index = std::size_t{0};

            std::tie (child_slot, index) =
                orig_node->lookup<KeyType> (transaction.db (), value.first, equal_);
            if (index == details::not_found) {
                // The key wasn't present in the node so we simply append it.
                // TODO: keep these entries sorted?

                // Load into memory with space for 1 new child node.
                std::unique_ptr<linear_node> new_node = linear_node::allocate_from (*orig_node, 1U);
                index = orig_node->size ();
                (*new_node)[index] = this->store_leaf_node (transaction, value, parents);
                result = new_node.release ();
            } else {
                key_exists = true;
                if (is_upsert) {
                    std::unique_ptr<linear_node> new_node;
                    linear_node * lnode = nullptr;

                    if (node.is_heap ()) {
                        // If the node is already on the heap then there's no need to reallocate it.
                        lnode = node.untag<linear_node *> ();
                        result = node;
                    } else {
                        // Load into memory but no extra space.
                        new_node = linear_node::allocate_from (*orig_node, 0U);
                        lnode = new_node.get ();
                        result = lnode;
                    }
                    (*lnode)[index] = this->store_leaf_node (transaction, value, parents);
                    new_node.release ();
                } else {
                    parents->push (details::parent_type{index_pointer{(*orig_node)[index]}});

                    // We didn't modify the node so our return value is the original node index
                    // pointer.
                    result = node;
                }
            }

            parents->push (details::parent_type{result, index});
            return {result, key_exists};
        }